

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations3L1Q<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *P1,
            Matrix<double,_4,_1,_0,_4,_1> *P1_B)

{
  Type local_1e8;
  Type local_1b0;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  local_178;
  Matrix<double,_4,_4,_0,_4,_4> transU;
  Matrix<double,_4,_4,_0,_4,_4> transU_B;
  
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&transU,4,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_1b0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)P1,3);
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_outerStride =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_outerStride
  ;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_startRow.m_value
       = local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
         super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_startRow.
         m_value;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>._40_8_ =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>._40_8_;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>._16_8_ =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>._16_8_;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_xpr =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_xpr;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_data =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_data;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_rows.m_value
       = local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
         super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_rows.
         m_value;
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>(&local_1e8,&transU,3,1)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const>>
            (&local_1e8,&local_178);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&transU_B,4,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_1b0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)P1_B,3);
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_outerStride =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_outerStride
  ;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_startRow.m_value
       = local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
         super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_startRow.
         m_value;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>._40_8_ =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>._40_8_;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>._16_8_ =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>._16_8_;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_xpr =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_xpr;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_data =
       local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_data;
  local_178.m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_rows.m_value
       = local_1b0.super_Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>.
         super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_rows.
         m_value;
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_1e8,(MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&transU_B,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const>>
            (&local_1e8,&local_178);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,&transU);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,&transU_B);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations3L1Q(
	Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P1_B)
{

	// translate frames to P1 and P1_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_B.head(3);

	vector<Matrix<floatPrec, 4,4>> out;
	out.push_back(transU);
	out.push_back(transU_B);

	return out;
}